

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_spec.cpp
# Opt level: O0

void P_SpawnPortal(line_t_conflict *line,int sectortag,int plane,int bytealpha,int linked)

{
  sector_t_conflict *from;
  sector_t_conflict *to;
  int type;
  TVector2<double> local_c0;
  uint local_ac;
  undefined1 local_a8 [4];
  uint pnum;
  TVector2<double> local_98;
  TVector2<double> local_88;
  undefined1 local_78 [8];
  DVector2 pos2;
  TVector2<double> local_58;
  TVector2<double> local_48;
  undefined1 local_38 [8];
  DVector2 pos1;
  int i;
  int linked_local;
  int bytealpha_local;
  int plane_local;
  int sectortag_local;
  line_t_conflict *line_local;
  
  if (((-1 < plane) && (plane < 3)) && ((linked == 0 || (plane != 2)))) {
    for (pos1.Y._4_4_ = 0; pos1.Y._4_4_ < numlines; pos1.Y._4_4_ = pos1.Y._4_4_ + 1) {
      if ((((lines[pos1.Y._4_4_].special == 0x39) && (lines[pos1.Y._4_4_].args[0] == sectortag)) &&
          (lines[pos1.Y._4_4_].args[1] == linked)) &&
         ((lines[pos1.Y._4_4_].args[2] == plane && (lines[pos1.Y._4_4_].args[3] == 1)))) {
        vertex_t::fPos((vertex_t *)&local_48);
        line_t::Delta((line_t *)&pos2.Y);
        TVector2<double>::operator/(&local_58,2.0);
        TVector2<double>::operator+((TVector2<double> *)local_38,&local_48);
        vertex_t::fPos((vertex_t *)&local_88);
        line_t::Delta((line_t *)local_a8);
        TVector2<double>::operator/(&local_98,2.0);
        TVector2<double>::operator+((TVector2<double> *)local_78,&local_88);
        type = 2;
        if (linked != 0) {
          type = 3;
        }
        from = line->frontsector;
        to = lines[pos1.Y._4_4_].frontsector;
        TVector2<double>::operator-(&local_c0,(TVector2<double> *)local_78);
        local_ac = P_GetPortal(type,plane,from,to,&local_c0);
        CopyPortal(sectortag,plane,local_ac,(double)bytealpha / 255.0,false);
        return;
      }
    }
  }
  return;
}

Assistant:

void P_SpawnPortal(line_t *line, int sectortag, int plane, int bytealpha, int linked)
{
	if (plane < 0 || plane > 2 || (linked && plane == 2)) return;
	for (int i=0;i<numlines;i++)
	{
		// We must look for the reference line with a linear search unless we want to waste the line ID for it
		// which is not a good idea.
		if (lines[i].special == Sector_SetPortal &&
			lines[i].args[0] == sectortag &&
			lines[i].args[1] == linked &&
			lines[i].args[2] == plane &&
			lines[i].args[3] == 1)
		{
			// beware of overflows.
			DVector2 pos1 = line->v1->fPos() + line->Delta() / 2;
			DVector2 pos2 = lines[i].v1->fPos() + lines[i].Delta() / 2;
			unsigned pnum = P_GetPortal(linked ? PORTS_LINKEDPORTAL : PORTS_PORTAL, plane, line->frontsector, lines[i].frontsector, pos2 - pos1);
			CopyPortal(sectortag, plane, pnum, bytealpha / 255., false);
			return;
		}
	}
}